

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O2

int pkcs7_bundle_certificates_cb(CBB *out,void *arg)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  X509 *x509;
  ulong i;
  uint8_t *buf;
  CBB certificates;
  uint8_t *puStack_68;
  CBB local_60;
  
  iVar1 = CBB_add_asn1(out,&local_60,0xa0000000);
  if (iVar1 != 0) {
    for (i = 0; sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)arg), i < sVar3; i = i + 1) {
      x509 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)arg,i);
      uVar2 = i2d_X509(x509,(uint8_t **)0x0);
      if ((int)uVar2 < 0) {
        return 0;
      }
      iVar1 = CBB_add_space(&local_60,&puStack_68,(ulong)uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = i2d_X509(x509,&puStack_68);
      if (iVar1 < 0) {
        return 0;
      }
    }
    iVar1 = CBB_flush_asn1_set_of(&local_60);
    if (iVar1 != 0) {
      iVar1 = CBB_flush(out);
      return (uint)(iVar1 != 0);
    }
  }
  return 0;
}

Assistant:

static int pkcs7_bundle_certificates_cb(CBB *out, void *arg) {
  auto *certs = static_cast<const STACK_OF(X509) *>(arg);
  size_t i;
  CBB certificates;

  // See https://tools.ietf.org/html/rfc2315#section-9.1
  if (!CBB_add_asn1(out, &certificates,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    return 0;
  }

  for (i = 0; i < sk_X509_num(certs); i++) {
    X509 *x509 = sk_X509_value(certs, i);
    uint8_t *buf;
    int len = i2d_X509(x509, NULL);

    if (len < 0 || !CBB_add_space(&certificates, &buf, len) ||
        i2d_X509(x509, &buf) < 0) {
      return 0;
    }
  }

  // |certificates| is a implicitly-tagged SET OF.
  return CBB_flush_asn1_set_of(&certificates) && CBB_flush(out);
}